

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::IsPartOf_PDU::IsPartOf_PDU
          (IsPartOf_PDU *this,RelationshipRecord *RR,Vector *LocationOfPart,
          NamedLocationIdentifier *NLI,EntityType *PartType)

{
  KUINT16 KVar1;
  KFLOAT32 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IsPartOf_PDU_00223300;
  (this->m_RelRec).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RelationshipRecord_00226938;
  KVar1 = RR->m_ui16Pos;
  (this->m_RelRec).m_ui16Nature = RR->m_ui16Nature;
  (this->m_RelRec).m_ui16Pos = KVar1;
  (this->m_LocPrt).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002216b8
  ;
  KVar2 = LocationOfPart->m_f32Y;
  (this->m_LocPrt).m_f32X = LocationOfPart->m_f32X;
  (this->m_LocPrt).m_f32Y = KVar2;
  (this->m_LocPrt).m_f32Z = LocationOfPart->m_f32Z;
  (this->m_NmLocID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__NamedLocationIdentifier_00226620;
  KVar1 = NLI->m_ui16StnNum;
  (this->m_NmLocID).m_ui16StnName = NLI->m_ui16StnName;
  (this->m_NmLocID).m_ui16StnNum = KVar1;
  (this->m_PrtTyp).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00221f70
  ;
  KVar3 = PartType->m_ui8Domain;
  KVar1 = PartType->m_ui16Country;
  KVar4 = PartType->m_ui8Category;
  KVar5 = PartType->m_ui8SubCategory;
  KVar6 = PartType->m_ui8Specific;
  KVar7 = PartType->m_ui8Extra;
  (this->m_PrtTyp).m_ui8EntityKind = PartType->m_ui8EntityKind;
  (this->m_PrtTyp).m_ui8Domain = KVar3;
  (this->m_PrtTyp).m_ui16Country = KVar1;
  (this->m_PrtTyp).m_ui8Category = KVar4;
  (this->m_PrtTyp).m_ui8SubCategory = KVar5;
  (this->m_PrtTyp).m_ui8Specific = KVar6;
  (this->m_PrtTyp).m_ui8Extra = KVar7;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '$';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x34;
  return;
}

Assistant:

IsPartOf_PDU::IsPartOf_PDU( const RelationshipRecord & RR, const Vector & LocationOfPart,
                            const NamedLocationIdentifier & NLI, const EntityType & PartType ) :
    m_RelRec( RR ),
    m_LocPrt( LocationOfPart ),
    m_NmLocID( NLI ),
    m_PrtTyp( PartType )
{
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = IsPartOf_PDU_Type;
    m_ui16PDULength = IS_PART_OF_PDU_SIZE;
}